

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas2_d.cpp
# Opt level: O1

void dgemv(char trans,int m,int n,double alpha,double *a,int lda,double *x,int incx,double beta,
          double *y,int incy)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  string local_78;
  int local_54;
  double local_50;
  int local_44;
  double local_40;
  uint local_34;
  
  local_50 = alpha;
  local_44 = lda;
  local_40 = beta;
  local_34 = m;
  bVar2 = lsame(trans,'N');
  if (((bVar2) || (bVar2 = lsame(trans,'T'), bVar2)) || (bVar2 = lsame(trans,'C'), bVar2)) {
    if ((int)local_34 < 0) {
      uVar5 = 2;
    }
    else {
      if (-1 < n) {
        iVar3 = i4_max(1,local_34);
        if (iVar3 <= local_44) {
          uVar4 = 0;
          if (incx == 0) {
            uVar5 = 8;
          }
          else {
            uVar5 = 0xb;
            if (incy != 0) {
              uVar5 = uVar4;
            }
            uVar4 = (uint)(incy != 0);
          }
          goto LAB_00214d43;
        }
        uVar5 = 6;
        goto LAB_00214d3c;
      }
      uVar5 = 3;
    }
    uVar4 = 0;
  }
  else {
    uVar5 = 1;
LAB_00214d3c:
    uVar4 = 0;
  }
LAB_00214d43:
  if ((char)uVar4 == '\0') {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"DGEMV","");
    xerbla(&local_78,uVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  else if ((n != 0 && local_34 != 0) &&
          (((local_50 != 0.0 || (NAN(local_50))) || ((local_40 != 1.0 || (NAN(local_40))))))) {
    local_54 = (int)trans;
    bVar2 = lsame(trans,'N');
    uVar5 = n;
    uVar4 = local_34;
    if (bVar2) {
      uVar5 = local_34;
      uVar4 = n;
    }
    iVar3 = (1 - uVar4) * incx;
    if (0 < incx) {
      iVar3 = 0;
    }
    iVar1 = (1 - uVar5) * incy;
    if (0 < incy) {
      iVar1 = 0;
    }
    if ((local_40 != 1.0) || (NAN(local_40))) {
      if (incy == 1) {
        if ((local_40 != 0.0) || (NAN(local_40))) {
          if (0 < (int)uVar5) {
            uVar8 = 0;
            do {
              y[uVar8] = y[uVar8] * local_40;
              uVar8 = uVar8 + 1;
            } while (uVar5 != uVar8);
          }
        }
        else if (0 < (int)uVar5) {
          local_40 = (double)CONCAT44(local_40._4_4_,iVar3);
          memset(y,0,(ulong)uVar5 << 3);
          iVar3 = local_40._0_4_;
        }
      }
      else if ((local_40 != 0.0) || (NAN(local_40))) {
        if (0 < (int)uVar5) {
          pdVar7 = y + iVar1;
          do {
            *pdVar7 = *pdVar7 * local_40;
            pdVar7 = pdVar7 + incy;
            uVar5 = uVar5 - 1;
          } while (uVar5 != 0);
        }
      }
      else if (0 < (int)uVar5) {
        pdVar7 = y + iVar1;
        do {
          *pdVar7 = 0.0;
          pdVar7 = pdVar7 + incy;
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
    }
    if ((local_50 != 0.0) || (NAN(local_50))) {
      local_40 = (double)CONCAT44(local_40._4_4_,iVar3);
      bVar2 = lsame((char)local_54,'N');
      if (bVar2) {
        if (incy == 1) {
          if (0 < n) {
            lVar6 = (long)local_40._0_4_;
            uVar8 = 0;
            do {
              dVar10 = x[lVar6];
              if (((dVar10 != 0.0) || (NAN(dVar10))) && (0 < (int)local_34)) {
                uVar9 = 0;
                do {
                  y[uVar9] = a[uVar9] * dVar10 * local_50 + y[uVar9];
                  uVar9 = uVar9 + 1;
                } while (local_34 != uVar9);
              }
              lVar6 = lVar6 + incx;
              uVar8 = uVar8 + 1;
              a = a + local_44;
            } while (uVar8 != (uint)n);
          }
        }
        else if (0 < n) {
          lVar6 = (long)local_40._0_4_;
          uVar8 = 0;
          do {
            dVar10 = x[lVar6];
            if (((dVar10 != 0.0) || (NAN(dVar10))) && (0 < (int)local_34)) {
              uVar9 = 0;
              pdVar7 = y + iVar1;
              do {
                *pdVar7 = a[uVar9] * dVar10 * local_50 + *pdVar7;
                uVar9 = uVar9 + 1;
                pdVar7 = pdVar7 + incy;
              } while (local_34 != uVar9);
            }
            lVar6 = lVar6 + incx;
            uVar8 = uVar8 + 1;
            a = a + local_44;
          } while (uVar8 != (uint)n);
        }
      }
      else if (incx == 1) {
        if (0 < n) {
          lVar6 = (long)iVar1;
          uVar8 = 0;
          do {
            if ((int)local_34 < 1) {
              dVar10 = 0.0;
            }
            else {
              dVar10 = 0.0;
              uVar9 = 0;
              do {
                dVar10 = dVar10 + a[uVar9] * x[uVar9];
                uVar9 = uVar9 + 1;
              } while (local_34 != uVar9);
            }
            y[lVar6] = dVar10 * local_50 + y[lVar6];
            lVar6 = lVar6 + incy;
            uVar8 = uVar8 + 1;
            a = a + local_44;
          } while (uVar8 != (uint)n);
        }
      }
      else if (0 < n) {
        lVar6 = (long)iVar1;
        uVar8 = 0;
        do {
          if ((int)local_34 < 1) {
            dVar10 = 0.0;
          }
          else {
            dVar10 = 0.0;
            uVar9 = 0;
            pdVar7 = x + local_40._0_4_;
            do {
              dVar10 = dVar10 + a[uVar9] * *pdVar7;
              uVar9 = uVar9 + 1;
              pdVar7 = pdVar7 + incx;
            } while (local_34 != uVar9);
          }
          y[lVar6] = dVar10 * local_50 + y[lVar6];
          lVar6 = lVar6 + incy;
          uVar8 = uVar8 + 1;
          a = a + local_44;
        } while (uVar8 != (uint)n);
      }
    }
  }
  return;
}

Assistant:

void dgemv ( char trans, int m, int n, double alpha, double a[], int lda, 
  double x[], int incx, double beta, double y[], int incy )

//****************************************************************************80
//
//  Purpose:
//
//    DGEMV computes y := alpha * A * x + beta * y for general matrix A.
//
//  Discussion:
//
//    DGEMV performs one of the matrix-vector operations
//      y := alpha*A *x + beta*y
//    or
//      y := alpha*A'*x + beta*y,
//    where alpha and beta are scalars, x and y are vectors and A is an
//    m by n matrix.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    02 April 2014
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Parameters:
//
//    Input, char TRANS, specifies the operation to be performed:
//    'n' or 'N'   y := alpha*A *x + beta*y.
//    't' or 'T'   y := alpha*A'*x + beta*y.
//    'c' or 'C'   y := alpha*A'*x + beta*y.
//
//    Input, int M, the number of rows of the matrix A.
//    0 <= M.
//
//    Input, int N, the number of columns of the matrix A.
//    0 <= N.
//
//    Input, double ALPHA, the scalar multiplier for A * x.
//
//    Input, double A[LDA*N].  The M x N subarray contains
//    the matrix A.
//
//    Input, int LDA, the the first dimension of A as declared
//    in the calling routine.  max ( 1, M ) <= LDA.
//
//    Input, double X[*], an array containing the vector to be 
//    multiplied by the matrix A.  
//    If TRANS = 'N' or 'n', then X must contain N entries, stored in INCX 
//    increments in a space of at least ( 1 + ( N - 1 ) * abs ( INCX ) ) 
//    locations.
//    Otherwise, X must contain M entries, store in INCX increments
//    in a space of at least ( 1 + ( M - 1 ) * abs ( INCX ) ) locations.
//
//    Input, int INCX, the increment for the elements of
//    X.  INCX must not be zero.
//
//    Input, double BETA, the scalar multiplier for Y.
//
//    Input/output, double Y[*], an array containing the vector to
//    be scaled and incremented by A*X.
//    If TRANS = 'N' or 'n', then Y must contain M entries, stored in INCY
//    increments in a space of at least ( 1 + ( M - 1 ) * abs ( INCY ) ) 
//    locations.
//    Otherwise, Y must contain N entries, store in INCY increments
//    in a space of at least ( 1 + ( N - 1 ) * abs ( INCY ) ) locations.
//
//    Input, int INCY, the increment for the elements of
//    Y.  INCY must not be zero.
//
{
  int i;
  int info;
  int ix;
  int iy;
  int j;
  int jx;
  int jy;
  int kx;
  int ky;
  int lenx;
  int leny;
  double temp;
//
//  Test the input parameters.
//
  info = 0;
  if ( ! lsame ( trans, 'N' ) &&
       ! lsame ( trans, 'T' ) &&
       ! lsame ( trans, 'C' ) ) 
  {
    info = 1;
  }
  else if ( m < 0 )
  {
    info = 2;
  }
  else if ( n < 0 )
  {
    info = 3;
  }
  else if ( lda < i4_max ( 1, m ) )
  {
    info = 6;
  }
  else if ( incx == 0 )
  {
    info = 8;
  }
  else if ( incy == 0 )
  {
    info = 11;
  }

  if ( info != 0 )
  {
    xerbla ( "DGEMV", info );
    return;
  }
//
//  Quick return if possible.
//
  if ( ( m == 0 ) ||
       ( n == 0 ) ||
       ( ( alpha == 0.0 ) && ( beta == 1.0 ) ) )
 {
   return;
  }
//
//  Set LENX and LENY, the lengths of the vectors x and y, and set
//  up the start points in X and Y.
//
  if ( lsame ( trans, 'N' ) )
  {
    lenx = n;
    leny = m;
  }
  else
  {
    lenx = m;
    leny = n;
  }

  if ( 0 < incx )
  {
    kx = 0;
  }
  else
  {
    kx = 0 - ( lenx - 1 ) * incx;
  }

  if ( 0 < incy )
  {
    ky = 0;
  }
  else
  {
    ky = 0 - ( leny - 1 ) * incy;
  }
//
//  Start the operations. In this version the elements of A are
//  accessed sequentially with one pass through A.
//
//  First form  y := beta*y.
//
  if ( beta != 1.0 )
  {
    if ( incy == 1 )
    {
      if ( beta == 0.0 )
      {
        for ( i = 0; i < leny; i++ )
        {
          y[i] = 0.0;
        }
      }
      else
      {
        for ( i = 0; i < leny; i++ )
        {
          y[i] = beta * y[i];
        }
      }
    }
    else
    {
      iy = ky;
      if ( beta == 0.0 )
      {
        for ( i = 0; i < leny; i++ )
        {
          y[iy] = 0.0;
          iy = iy + incy;
        }
      }
      else
      {
        for ( i = 0; i < leny; i++ )
        {
          y[iy] = beta * y[iy];
          iy = iy + incy;
        }
      }
    }
  }

  if ( alpha == 0.0 )
  {
    return;
  }
//
//  Form y := alpha*A*x + y.
//
  if ( lsame ( trans, 'N' ) )
  {
    jx = kx;
    if ( incy == 1 )
    {
      for ( j = 0; j < n; j++ )
      {
        if ( x[jx] != 0.0 )
        {
          temp = alpha * x[jx];
          for ( i = 0; i < m; i++ )
          {
            y[i] = y[i] + temp * a[i+j*lda];
          }
        }
        jx = jx + incx;
      }
    }
    else
    {
      for ( j = 0; j < n; j++ )
      {
        if ( x[jx] != 0.0 )
        {
          temp = alpha * x[jx];
          iy = ky;
          for ( i = 0; i < m; i++ )
          {
            y[iy] = y[iy] + temp * a[i+j*lda];
            iy = iy + incy;
          }
        }
        jx = jx + incx;
      }
    }
  }
/*
  Form y := alpha*A'*x + y.
*/
  else
  {
    jy = ky;
    if ( incx == 1 )
    {
      for ( j = 0; j < n; j++ )
      {
        temp = 0.0;
        for ( i = 0; i < m; i++ )
        {
          temp = temp + a[i+j*lda] * x[i];
        }
        y[jy] = y[jy] + alpha * temp;
        jy = jy + incy;
      }
    }
    else
    {
      for ( j = 0; j < n; j++ )
      {
        temp = 0.0;
        ix = kx;
        for ( i = 0; i < m; i++ )
        {
          temp = temp + a[i+j*lda] * x[ix];
          ix = ix + incx;
        }
        y[jy] = y[jy] + alpha * temp;
        jy = jy + incy;
      }
    }
  }

  return;
}